

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

Status __thiscall
google::protobuf::File::ReadFileToString(File *this,string *name,string *output,bool text_mode)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  undefined7 in_register_00000009;
  char *__modes;
  string_view message;
  string_view message_00;
  char *pcStack_440;
  char buffer [1024];
  
  __modes = "rb";
  if ((int)CONCAT71(in_register_00000009,text_mode) != 0) {
    __modes = "rt";
  }
  __stream = fopen((name->_M_dataplus)._M_p,__modes);
  if (__stream == (FILE *)0x0) {
    message._M_str = &DAT_00000013;
    message._M_len = (size_t)this;
    absl::lts_20250127::NotFoundError(message);
  }
  else {
    while (sVar3 = fread(buffer,1,0x400,__stream), sVar3 != 0) {
      std::__cxx11::string::append((char *)output,(ulong)buffer);
    }
    iVar1 = ferror(__stream);
    iVar2 = fclose(__stream);
    if (iVar2 == 0) {
      if (iVar1 == 0) {
        *(undefined8 *)this = 1;
        return (Status)(uintptr_t)this;
      }
      pcStack_440 = (char *)0x12;
    }
    else {
      pcStack_440 = (char *)0x14;
    }
    message_00._M_str = pcStack_440;
    message_00._M_len = (size_t)this;
    absl::lts_20250127::InternalError(message_00);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status File::ReadFileToString(const std::string& name,
                                    std::string* output, bool text_mode) {
  char buffer[1024];
  FILE* file = fopen(name.c_str(), text_mode ? "rt" : "rb");
  if (file == nullptr) return absl::NotFoundError("Could not open file");

  while (true) {
    size_t n = fread(buffer, 1, sizeof(buffer), file);
    if (n <= 0) break;
    output->append(buffer, n);
  }

  int error = ferror(file);
  if (fclose(file) != 0) return absl::InternalError("Failed to close file");
  if (error != 0) return absl::InternalError("Error parsing file");
  return absl::OkStatus();
}